

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_container_iterate(run_container_t *cont,uint32_t base,roaring_iterator iterator,void *ptr)

{
  ushort uVar1;
  ushort uVar2;
  _Bool _Var3;
  int local_40;
  int j;
  int iStack_34;
  uint16_t le;
  uint32_t run_start;
  int i;
  void *ptr_local;
  roaring_iterator iterator_local;
  uint32_t base_local;
  run_container_t *cont_local;
  
  iStack_34 = 0;
  do {
    if (cont->n_runs <= iStack_34) {
      return true;
    }
    uVar1 = cont->runs[iStack_34].value;
    uVar2 = cont->runs[iStack_34].length;
    for (local_40 = 0; local_40 <= (int)(uint)uVar2; local_40 = local_40 + 1) {
      _Var3 = (*iterator)(base + uVar1 + local_40,ptr);
      if (!_Var3) {
        return false;
      }
    }
    iStack_34 = iStack_34 + 1;
  } while( true );
}

Assistant:

bool run_container_iterate(const run_container_t *cont, uint32_t base,
                           roaring_iterator iterator, void *ptr) {
    for (int i = 0; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;

        for (int j = 0; j <= le; ++j)
            if (!iterator(run_start + j, ptr)) return false;
    }
    return true;
}